

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::XmlUnitTestResultPrinter::PrintXmlUnitTest
               (ostream *stream,UnitTest *unit_test)

{
  int iVar1;
  ostream *poVar2;
  TestCase *pTVar3;
  TimeInMillis ms;
  TimeInMillis ms_00;
  TestResult *extraout_RDX;
  TestResult *extraout_RDX_00;
  TestResult *result;
  int i;
  int i_00;
  undefined1 local_88 [8];
  string kTestsuites;
  string local_48;
  int local_28;
  allocator<char> local_21;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_88,"testsuites",(allocator<char> *)&local_48);
  std::operator<<(stream,"<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n");
  poVar2 = std::operator<<(stream,"<");
  std::operator<<(poVar2,(string *)local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"tests",&local_21);
  local_28 = UnitTest::reportable_test_count(unit_test);
  StreamableToString<int>((string *)((long)&kTestsuites.field_2 + 8),&local_28);
  OutputXmlAttribute(stream,(string *)local_88,&local_48,(string *)((long)&kTestsuites.field_2 + 8))
  ;
  std::__cxx11::string::~string((string *)(kTestsuites.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"failures",&local_21);
  local_28 = UnitTest::failed_test_count(unit_test);
  StreamableToString<int>((string *)((long)&kTestsuites.field_2 + 8),&local_28);
  OutputXmlAttribute(stream,(string *)local_88,&local_48,(string *)((long)&kTestsuites.field_2 + 8))
  ;
  std::__cxx11::string::~string((string *)(kTestsuites.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"disabled",&local_21);
  local_28 = UnitTest::reportable_disabled_test_count(unit_test);
  StreamableToString<int>((string *)((long)&kTestsuites.field_2 + 8),&local_28);
  OutputXmlAttribute(stream,(string *)local_88,&local_48,(string *)((long)&kTestsuites.field_2 + 8))
  ;
  std::__cxx11::string::~string((string *)(kTestsuites.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"errors",(allocator<char> *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(kTestsuites.field_2._M_local_buf + 8),"0",&local_21);
  OutputXmlAttribute(stream,(string *)local_88,&local_48,(string *)((long)&kTestsuites.field_2 + 8))
  ;
  std::__cxx11::string::~string((string *)(kTestsuites.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"timestamp",(allocator<char> *)&local_28);
  FormatEpochTimeInMillisAsIso8601_abi_cxx11_
            ((string *)((long)&kTestsuites.field_2 + 8),
             (internal *)unit_test->impl_->start_timestamp_,ms);
  OutputXmlAttribute(stream,(string *)local_88,&local_48,(string *)((long)&kTestsuites.field_2 + 8))
  ;
  std::__cxx11::string::~string((string *)(kTestsuites.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"time",(allocator<char> *)&local_28);
  FormatTimeInMillisAsSeconds_abi_cxx11_
            ((string *)((long)&kTestsuites.field_2 + 8),(internal *)unit_test->impl_->elapsed_time_,
             ms_00);
  OutputXmlAttribute(stream,(string *)local_88,&local_48,(string *)((long)&kTestsuites.field_2 + 8))
  ;
  std::__cxx11::string::~string((string *)(kTestsuites.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_48);
  result = extraout_RDX;
  if (FLAGS_gtest_shuffle == '\x01') {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"random_seed",&local_21);
    local_28 = unit_test->impl_->random_seed_;
    StreamableToString<int>((string *)((long)&kTestsuites.field_2 + 8),&local_28);
    OutputXmlAttribute(stream,(string *)local_88,&local_48,
                       (string *)((long)&kTestsuites.field_2 + 8));
    std::__cxx11::string::~string((string *)(kTestsuites.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_48);
    result = extraout_RDX_00;
  }
  TestPropertiesAsXmlAttributes_abi_cxx11_
            (&local_48,(XmlUnitTestResultPrinter *)&unit_test->impl_->ad_hoc_test_result_,result);
  std::operator<<(stream,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"name",(allocator<char> *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(kTestsuites.field_2._M_local_buf + 8),"AllTests",&local_21);
  OutputXmlAttribute(stream,(string *)local_88,&local_48,(string *)((long)&kTestsuites.field_2 + 8))
  ;
  std::__cxx11::string::~string((string *)(kTestsuites.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_48);
  std::operator<<(stream,">\n");
  for (i_00 = 0;
      i_00 < (int)((ulong)((long)(unit_test->impl_->test_cases_).
                                 super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(unit_test->impl_->test_cases_).
                                super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3); i_00 = i_00 + 1) {
    pTVar3 = UnitTest::GetTestCase(unit_test,i_00);
    iVar1 = TestCase::reportable_test_count(pTVar3);
    if (0 < iVar1) {
      pTVar3 = UnitTest::GetTestCase(unit_test,i_00);
      PrintXmlTestCase(stream,pTVar3);
    }
  }
  poVar2 = std::operator<<(stream,"</");
  poVar2 = std::operator<<(poVar2,(string *)local_88);
  std::operator<<(poVar2,">\n");
  std::__cxx11::string::~string((string *)local_88);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::PrintXmlUnitTest(std::ostream* stream,
                                                const UnitTest& unit_test) {
  const std::string kTestsuites = "testsuites";

  *stream << "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n";
  *stream << "<" << kTestsuites;

  OutputXmlAttribute(stream, kTestsuites, "tests",
                     StreamableToString(unit_test.reportable_test_count()));
  OutputXmlAttribute(stream, kTestsuites, "failures",
                     StreamableToString(unit_test.failed_test_count()));
  OutputXmlAttribute(
      stream, kTestsuites, "disabled",
      StreamableToString(unit_test.reportable_disabled_test_count()));
  OutputXmlAttribute(stream, kTestsuites, "errors", "0");
  OutputXmlAttribute(
      stream, kTestsuites, "timestamp",
      FormatEpochTimeInMillisAsIso8601(unit_test.start_timestamp()));
  OutputXmlAttribute(stream, kTestsuites, "time",
                     FormatTimeInMillisAsSeconds(unit_test.elapsed_time()));

  if (GTEST_FLAG(shuffle)) {
    OutputXmlAttribute(stream, kTestsuites, "random_seed",
                       StreamableToString(unit_test.random_seed()));
  }

  *stream << TestPropertiesAsXmlAttributes(unit_test.ad_hoc_test_result());

  OutputXmlAttribute(stream, kTestsuites, "name", "AllTests");
  *stream << ">\n";

  for (int i = 0; i < unit_test.total_test_case_count(); ++i) {
    if (unit_test.GetTestCase(i)->reportable_test_count() > 0)
      PrintXmlTestCase(stream, *unit_test.GetTestCase(i));
  }
  *stream << "</" << kTestsuites << ">\n";
}